

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O3

DecodeStatus DecodeL4RSrcDstSrcDstInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint *Op3_00;
  uint RegNo;
  uint Op3;
  uint Op2;
  uint Op1;
  uint local_2c;
  uint local_28;
  uint local_24;
  
  Op3_00 = &local_2c;
  DVar1 = Decode3OpInstruction(Insn & 0xffff,&local_24,&local_28,Op3_00);
  if (DVar1 == MCDisassembler_Success) {
    RegNo = Insn >> 0x10 & 0xf;
    DecodeGRRegsRegisterClass(Inst,local_24,Address,Op3_00);
    DVar1 = DecodeGRRegsRegisterClass(Inst,RegNo,Address,Op3_00);
    if (DVar1 == MCDisassembler_Success) {
      DecodeGRRegsRegisterClass(Inst,local_24,Address,Op3_00);
      DecodeGRRegsRegisterClass(Inst,RegNo,Address,Op3_00);
      DecodeGRRegsRegisterClass(Inst,local_28,Address,Op3_00);
      DecodeGRRegsRegisterClass(Inst,local_2c,Address,Op3_00);
      DVar1 = MCDisassembler_Success;
    }
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeL4RSrcDstSrcDstInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		void *Decoder)
{
	unsigned Op1, Op2, Op3;
	unsigned Op4 = fieldFromInstruction_4(Insn, 16, 4);
	DecodeStatus S =
		Decode3OpInstruction(fieldFromInstruction_4(Insn, 0, 16), &Op1, &Op2, &Op3);
	if (S == MCDisassembler_Success) {
		DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
		S = DecodeGRRegsRegisterClass(Inst, Op4, Address, Decoder);
	}

	if (S == MCDisassembler_Success) {
		DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op4, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op2, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op3, Address, Decoder);
	}

	return S;
}